

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_c92d48::HandleReadSymlinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  Status SVar2;
  bool bVar3;
  string_view value;
  string result;
  string local_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    SVar2 = cmsys::SystemTools::ReadSymlink(pbVar1 + 1,&local_b8);
    bVar3 = SVar2.Kind_ == Success;
    if (bVar3) {
      value._M_str = local_b8._M_dataplus._M_p;
      value._M_len = local_b8._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,pbVar1 + 2,value);
    }
    else {
      local_48.View_._M_len = 0x38;
      local_48.View_._M_str = "READ_SYMLINK requested of path that is not a symlink:\n  ";
      local_78.View_._M_str = pbVar1[1]._M_dataplus._M_p;
      local_78.View_._M_len = pbVar1[1]._M_string_length;
      cmStrCat<>(&local_98,&local_48,&local_78);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    local_48.View_._M_str = (pbVar1->_M_dataplus)._M_p;
    local_48.View_._M_len = pbVar1->_M_string_length;
    local_78.View_._M_len = 0x29;
    local_78.View_._M_str = " requires a file name and output variable";
    cmStrCat<>(&local_b8,&local_48,&local_78);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_b8);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool HandleReadSymlinkCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires a file name and output variable"));
    return false;
  }

  const std::string& filename = args[1];
  const std::string& outputVariable = args[2];

  std::string result;
  if (!cmSystemTools::ReadSymlink(filename, result)) {
    status.SetError(cmStrCat(
      "READ_SYMLINK requested of path that is not a symlink:\n  ", filename));
    return false;
  }

  status.GetMakefile().AddDefinition(outputVariable, result);

  return true;
}